

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixFileSize(sqlite3_file *id,i64 *pSize)

{
  int iVar1;
  int *piVar2;
  i64 iVar3;
  stat buf;
  undefined1 local_a0 [48];
  long local_70;
  
  iVar1 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&id[3].pMethods,local_a0);
  if (iVar1 == 0) {
    iVar1 = 0;
    iVar3 = 0;
    if (local_70 != 1) {
      iVar3 = local_70;
    }
    *pSize = iVar3;
  }
  else {
    piVar2 = __errno_location();
    *(int *)&id[4].pMethods = *piVar2;
    iVar1 = 0x70a;
  }
  return iVar1;
}

Assistant:

static int unixFileSize(sqlite3_file *id, i64 *pSize){
  int rc;
  struct stat buf;
  assert( id );
  rc = osFstat(((unixFile*)id)->h, &buf);
  SimulateIOError( rc=1 );
  if( rc!=0 ){
    ((unixFile*)id)->lastErrno = errno;
    return SQLITE_IOERR_FSTAT;
  }
  *pSize = buf.st_size;

  /* When opening a zero-size database, the findInodeInfo() procedure
  ** writes a single byte into that file in order to work around a bug
  ** in the OS-X msdos filesystem.  In order to avoid problems with upper
  ** layers, we need to report this file size as zero even though it is
  ** really 1.   Ticket #3260.
  */
  if( *pSize==1 ) *pSize = 0;


  return SQLITE_OK;
}